

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::~BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    if ((this_00->ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

BatchedMatMulLayerParams::~BatchedMatMulLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BatchedMatMulLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}